

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Label __thiscall
asmjit::BaseBuilder::newNamedLabel
          (BaseBuilder *this,char *name,size_t nameSize,uint32_t type,uint32_t parentId)

{
  Error EVar1;
  undefined4 in_register_0000000c;
  uint32_t extraout_RDX [2];
  uint32_t extraout_RDX_00 [2];
  undefined4 uVar2;
  uint32_t in_R9D;
  Label LVar3;
  LabelEntry *le;
  
  uVar2 = 0xffffffff;
  if (*(CodeHolder **)(name + 0x18) != (CodeHolder *)0x0) {
    EVar1 = CodeHolder::newNamedLabelEntry
                      (*(CodeHolder **)(name + 0x18),&le,(char *)nameSize,
                       CONCAT44(in_register_0000000c,type),parentId,in_R9D);
    nameSize = (size_t)extraout_RDX;
    if (EVar1 == 0) {
      EVar1 = BaseBuilder_newLabelInternal((BaseBuilder *)name,*(uint32_t *)&le->field_0xc);
      nameSize = (size_t)extraout_RDX_00;
      if (EVar1 == 0) {
        uVar2 = *(undefined4 *)&le->field_0xc;
      }
    }
  }
  *(undefined4 *)&(this->super_BaseEmitter)._vptr_BaseEmitter = 4;
  *(undefined4 *)((long)&(this->super_BaseEmitter)._vptr_BaseEmitter + 4) = uVar2;
  (this->super_BaseEmitter)._emitterType = '\0';
  (this->super_BaseEmitter)._emitterFlags = '\0';
  (this->super_BaseEmitter)._validationFlags = '\0';
  (this->super_BaseEmitter)._validationOptions = '\0';
  (this->super_BaseEmitter)._encodingOptions = 0;
  LVar3.super_Operand.super_Operand_._data[0] = (uint32_t)nameSize;
  LVar3.super_Operand.super_Operand_._data[1] = SUB84(nameSize,4);
  LVar3.super_Operand.super_Operand_._0_8_ = this;
  return (Label)LVar3.super_Operand.super_Operand_;
}

Assistant:

Label BaseBuilder::newNamedLabel(const char* name, size_t nameSize, uint32_t type, uint32_t parentId) {
  uint32_t labelId = Globals::kInvalidId;
  LabelEntry* le;

  if (_code &&
      _code->newNamedLabelEntry(&le, name, nameSize, type, parentId) == kErrorOk &&
      BaseBuilder_newLabelInternal(this, le->id()) == kErrorOk) {
    labelId = le->id();
  }

  return Label(labelId);
}